

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

void google::protobuf::io::Tokenizer::ParseStringAppend(string *text,string *output)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  char *in_RCX;
  uint uVar5;
  long lVar6;
  uint32_t x;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  UntypedFormatSpecImpl format;
  string_view str;
  string_view src;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  LogMessage local_60;
  Data local_50;
  code *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (text->_M_string_length == 0) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x48a);
    str._M_str = 
    " Tokenizer::ParseStringAppend() passed text that could not have been tokenized as a string: ";
    str._M_len = 0x5c;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_60,str);
    src._M_str = in_RCX;
    src._M_len = (size_t)(text->_M_dataplus)._M_p;
    absl::lts_20250127::CEscape_abi_cxx11_
              ((string *)&local_50,(lts_20250127 *)text->_M_string_length,src);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_60,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.ptr != &local_40) {
      operator_delete(local_50.ptr,local_40._M_allocated_capacity + 1);
    }
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_60);
    return;
  }
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(output->_M_dataplus)._M_p != &output->field_2) {
    uVar4 = (output->field_2)._M_allocated_capacity;
  }
  if (uVar4 < text->_M_string_length + output->_M_string_length) {
    std::__cxx11::string::reserve((ulong)output);
  }
  pbVar10 = (byte *)(text->_M_dataplus)._M_p;
LAB_002dedbf:
  bVar1 = pbVar10[1];
  if (bVar1 == 0x5c) {
    bVar2 = pbVar10[2];
    if (bVar2 == 0) goto LAB_002dee2f;
    pbVar8 = pbVar10 + 2;
    if ((bVar2 & 0xf8) == 0x30) {
      if ((pbVar10[3] & 0xf8) == 0x30) {
        pbVar8 = pbVar10 + 3;
      }
      if ((pbVar8[1] & 0xf8) == 0x30) {
        pbVar8 = pbVar8 + 1;
      }
      goto LAB_002dee4a;
    }
    if (bVar2 < 0x62) {
      if (bVar2 < 0x55) {
        if (((bVar2 == 0x22) || (bVar2 == 0x27)) || (bVar2 == 0x3f)) goto LAB_002dee4a;
      }
      else if (bVar2 < 0x5c) {
        if (bVar2 == 0x55) goto switchD_002dee8d_caseD_75;
        if (bVar2 == 0x58) goto switchD_002dee8d_caseD_78;
      }
      else if ((bVar2 == 0x5c) || (bVar2 == 0x61)) goto LAB_002dee4a;
switchD_002dee8d_caseD_6f:
    }
    else {
      switch(bVar2) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
        goto switchD_002dee8d_caseD_6f;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
switchD_002dee8d_caseD_75:
        uVar5 = (uint)(bVar2 == 0x55) << 3;
        if (bVar2 == 0x75) {
          uVar5 = 4;
        }
        if (uVar5 != 0) {
          pbVar7 = pbVar10 + 3;
          uVar4 = (ulong)(uVar5 | 3);
          pbVar9 = pbVar10 + uVar4;
          x = 0;
          do {
            if ((ulong)*pbVar7 == 0) goto LAB_002dee4a;
            x = (int)(char)io::(anonymous_namespace)::kAsciiToInt[*pbVar7] + x * 0x10;
            pbVar7 = pbVar7 + 1;
          } while (pbVar7 < pbVar9);
          if ((x & 0xfffffc00) == 0xd800) {
            if ((*pbVar9 == 0x5c) && (pbVar9[1] == 0x75)) {
              lVar6 = 0;
              uVar3 = 0;
              do {
                if ((ulong)pbVar10[lVar6 + (ulong)uVar5 + 5] == 0) goto LAB_002deffd;
                uVar3 = (int)(char)io::(anonymous_namespace)::kAsciiToInt
                                   [pbVar10[lVar6 + (ulong)uVar5 + 5]] + uVar3 * 0x10;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 4);
              if ((uVar3 & 0xfffffc00) == 0xdc00) {
                x = x * 0x400 + uVar3 + 0xfca02400;
                uVar4 = uVar4 + 6;
              }
              goto LAB_002deffd;
            }
LAB_002df060:
            x = (x & 0xf000) * 0x10 + (x & 0x3f) + (x & 0xfc0) * 4 + 0xe08080;
            lVar6 = 3;
LAB_002df087:
            local_60.errno_saver_.saved_errno_ = ghtonl(x);
            std::__cxx11::string::append((char *)output,(long)&local_60 + (4 - lVar6));
          }
          else {
LAB_002deffd:
            pbVar9 = pbVar10 + uVar4;
            lVar6 = 1;
            if (x < 0x80) goto LAB_002df087;
            if (x < 0x800) {
              x = (x & 0x3f) + (x & 0x7c0) * 4 + 0xc080;
              lVar6 = 2;
              goto LAB_002df087;
            }
            if (x < 0x10000) goto LAB_002df060;
            if (x < 0x110000) {
              x = (x & 0x3f | (x & 0x3f000) << 4 | (x & 0x1c0000) << 6) + (x & 0xfc0) * 4 +
                  0xf0808080;
              lVar6 = 4;
              goto LAB_002df087;
            }
            local_50._4_4_ = 0;
            local_50._0_4_ = x;
            local_48 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                       Dispatch<unsigned_int>;
            format.size_ = 6;
            format.data_ = "\\U%08x";
            args.len_ = 1;
            args.ptr_ = (pointer)&local_50;
            absl::lts_20250127::str_format_internal::AppendPack(output,format,args);
          }
          pbVar10 = pbVar9 + -1;
          goto LAB_002dedbf;
        }
        break;
      case 0x76:
        break;
      case 0x78:
switchD_002dee8d_caseD_78:
        if (((byte)(pbVar10[3] - 0x30) < 10) ||
           ((uVar5 = pbVar10[3] - 0x41, uVar5 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))) {
          pbVar8 = pbVar10 + 3;
        }
        if (((byte)(pbVar8[1] - 0x30) < 10) ||
           ((uVar5 = pbVar8[1] - 0x41, uVar5 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))) {
          pbVar8 = pbVar8 + 1;
        }
        break;
      default:
        if ((bVar2 != 0x62) && (bVar2 != 0x66)) goto switchD_002dee8d_caseD_6f;
      }
    }
  }
  else {
    if (bVar1 == 0) {
      return;
    }
LAB_002dee2f:
    pbVar8 = pbVar10 + 1;
    if ((bVar1 == *(text->_M_dataplus)._M_p) &&
       (pbVar9 = pbVar10 + 2, pbVar10 = pbVar8, *pbVar9 == 0)) goto LAB_002dedbf;
  }
LAB_002dee4a:
  pbVar10 = pbVar8;
  std::__cxx11::string::push_back((char)output);
  goto LAB_002dedbf;
}

Assistant:

void Tokenizer::ParseStringAppend(const std::string& text,
                                  std::string* output) {
  // Reminder: text[0] is always a quote character.  (If text is
  // empty, it's invalid, so we'll just return).
  const size_t text_size = text.size();
  if (text_size == 0) {
    ABSL_DLOG(FATAL)
        << " Tokenizer::ParseStringAppend() passed text that could not"
           " have been tokenized as a string: "
        << absl::CEscape(text);
    return;
  }

  // Reserve room for new string. The branch is necessary because if
  // there is already space available the reserve() call might
  // downsize the output.
  const size_t new_len = text_size + output->size();
  if (new_len > output->capacity()) {
    output->reserve(new_len);
  }

  // Loop through the string copying characters to "output" and
  // interpreting escape sequences.  Note that any invalid escape
  // sequences or other errors were already reported while tokenizing.
  // In this case we do not need to produce valid results.
  for (const char* ptr = text.c_str() + 1; *ptr != '\0'; ptr++) {
    if (*ptr == '\\' && ptr[1] != '\0') {
      // An escape sequence.
      ++ptr;

      if (OctalDigit::InClass(*ptr)) {
        // An octal escape.  May one, two, or three digits.
        int code = DigitValue(*ptr);
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'x' || *ptr == 'X') {
        // A hex escape.  May zero, one, or two digits.  (The zero case
        // will have been caught as an error earlier.)
        int code = 0;
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = DigitValue(*ptr);
        }
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 16 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'u' || *ptr == 'U') {
        uint32_t unicode;
        const char* end = FetchUnicodePoint(ptr, &unicode);
        if (end == ptr) {
          // Failure: Just dump out what we saw, don't try to parse it.
          output->push_back(*ptr);
        } else {
          AppendUTF8(unicode, output);
          ptr = end - 1;  // Because we're about to ++ptr.
        }
      } else {
        // Some other escape code.
        output->push_back(TranslateEscape(*ptr));
      }

    } else if (*ptr == text[0] && ptr[1] == '\0') {
      // Ignore final quote matching the starting quote.
    } else {
      output->push_back(*ptr);
    }
  }
}